

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cose.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::cose::Sign1Message::Serialize
          (Error *__return_storage_ptr__,Sign1Message *this,ByteArray *aBuf)

{
  HCOSE msg;
  size_t sVar1;
  uchar *rgb;
  size_type cb;
  size_t length;
  ByteArray *aBuf_local;
  Sign1Message *this_local;
  
  sVar1 = COSE_Encode((HCOSE)this->mSign,(byte *)0x0,0,0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(aBuf,sVar1 + 1);
  msg = (HCOSE)this->mSign;
  rgb = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(aBuf);
  cb = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(aBuf);
  sVar1 = COSE_Encode(msg,rgb,0,cb);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(aBuf,sVar1);
  Error::Error(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Error Sign1Message::Serialize(ByteArray &aBuf)
{
    size_t length;
    length = COSE_Encode(reinterpret_cast<HCOSE>(mSign), nullptr, 0, 0) + 1;
    aBuf.resize(length);
    length = COSE_Encode(reinterpret_cast<HCOSE>(mSign), aBuf.data(), 0, aBuf.size());
    aBuf.resize(length);

    return ERROR_NONE;
}